

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask31_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x1f | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 1;
  *puVar1 = in[2] << 0x1e | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 2;
  *puVar1 = in[3] << 0x1d | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 3;
  *puVar1 = in[4] << 0x1c | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] >> 4;
  *puVar1 = in[5] << 0x1b | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] >> 5;
  *puVar1 = in[6] << 0x1a | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[6] >> 6;
  *puVar1 = in[7] << 0x19 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[7] >> 7;
  *puVar1 = in[8] << 0x18 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[8] >> 8;
  *puVar1 = in[9] << 0x17 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[9] >> 9;
  *puVar1 = in[10] << 0x16 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[10] >> 10;
  *puVar1 = in[0xb] << 0x15 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xb] >> 0xb;
  *puVar1 = in[0xc] << 0x14 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xc] >> 0xc;
  *puVar1 = in[0xd] << 0x13 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xd] >> 0xd;
  *puVar1 = in[0xe] << 0x12 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xe] >> 0xe;
  *puVar1 = in[0xf] << 0x11 | *puVar1;
  out[0xf] = in[0xf] >> 0xf;
  return out + 0x10;
}

Assistant:

uint32_t *__fastpackwithoutmask31_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (31 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (31 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (31 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (31 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (31 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (31 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (31 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (31 - 16);
  ++in;

  return out + 1;
}